

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

Mat * ncnn::Mat::from_float16(unsigned_short *data,int size)

{
  bool bVar1;
  int in_EDX;
  unsigned_short *in_RSI;
  Mat *in_RDI;
  float fVar2;
  int remain;
  float *ptr;
  Mat *m;
  int in_stack_ffffffffffffffac;
  Mat *in_stack_ffffffffffffffb0;
  int local_34;
  float *local_30;
  unsigned_short *local_10;
  
  Mat(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,0x14ec62);
  bVar1 = empty(in_stack_ffffffffffffffb0);
  if (!bVar1) {
    local_30 = operator_cast_to_float_(in_RDI);
    local_10 = in_RSI;
    for (local_34 = in_EDX; 0 < local_34; local_34 = local_34 + -1) {
      fVar2 = half2float(*local_10);
      *local_30 = fVar2;
      local_10 = local_10 + 1;
      local_30 = local_30 + 1;
    }
  }
  return in_RDI;
}

Assistant:

Mat Mat::from_float16(const unsigned short* data, int size)
{
    Mat m(size);
    if (m.empty())
        return m;

    float* ptr = m;//.data;

#if __ARM_NEON && (__ARM_FP & 2)
    int nn = cpu_support_arm_vfpv4() ? size >> 2 : 0;
    int remain = size - (nn << 2);
#else
    int remain = size;
#endif // __ARM_NEON

#if __ARM_NEON && (__ARM_FP & 2)
#if __aarch64__
    if (nn > 0)
    {
    asm volatile(
        "0:                             \n"
        "ld1    {v0.4h}, [%1], #8       \n"
        "fcvtl  v1.4s, v0.4h            \n"
        "subs   %w0, %w0, #1            \n"
        "st1    {v1.4s}, [%2], #16      \n"
        "bne    0b                      \n"
        : "=r"(nn),     // %0
          "=r"(data),   // %1
          "=r"(ptr)     // %2
        : "0"(nn),
          "1"(data),
          "2"(ptr)
        : "cc", "memory", "v0", "v1"
    );
    }
#else
    if (nn > 0)
    {
    asm volatile(
        "0:                             \n"
        "pld        [%1, #64]           \n"
        "vld1.s16   {d0}, [%1 :64]!     \n"
        "vcvt.f32.f16 q1, d0            \n"
        "subs       %0, #1              \n"
        "vst1.f32   {d2-d3}, [%2 :128]! \n"
        "bne        0b                  \n"
        : "=r"(nn),     // %0
          "=r"(data),   // %1
          "=r"(ptr)     // %2
        : "0"(nn),
          "1"(data),
          "2"(ptr)
        : "cc", "memory", "q0", "q1"
    );
    }
#endif // __aarch64__
#endif // __ARM_NEON
    for (; remain>0; remain--)
    {
        *ptr = half2float(*data);

        data++;
        ptr++;
    }

    return m;
}